

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtCanonicizeCA(Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,int fCA)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  Abc_SccCost_t c;
  char local_1c8 [24];
  Abc_TgMan_t tgManCopy;
  Abc_TgMan_t tgMan;
  
  iVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar3 = 1;
  }
  if (nVars == 0) {
    Abc_TtClear(pTruth,1);
    uVar6 = 0;
  }
  else {
    Abc_TtVerifySmallTruth(pTruth,nVars);
    Abc_TtCopy(gpVerCopy,pTruth,iVar3,0);
    if (0x10 < nVars) {
      __assert_fail("nVars <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0xa5b,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    if (p == (Abc_TtHieMan_t *)0x0) {
      __assert_fail("p != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0xa5c,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    iVar2 = Abc_TtHieRetrieveOrInsert(p,-5,pTruth,pTruth);
    uVar6 = 0x20000000;
    if (iVar2 < 1) {
      Abc_TgInitMan(&tgMan,pTruth,nVars,2,p->vPhase);
      Abc_TgCreateGroups(&tgMan);
      iVar2 = Abc_TtHieRetrieveOrInsert(p,-4,pTruth,pTruth);
      if (iVar2 < 1) {
        Abc_TgPurgeSymmetry(&tgMan,1);
        Abc_TgExpendSymmetry(&tgMan,pCanonPerm);
        Abc_TgImplementPerm(&tgMan,pCanonPerm);
        iVar2 = Abc_TgCannonVerify(&tgMan);
        if (iVar2 == 0) {
          __assert_fail("Abc_TgCannonVerify(&tgMan)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0xa66,
                        "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                       );
        }
        iVar2 = Abc_TtHieRetrieveOrInsert(p,-3,pTruth,pTruth);
        if (iVar2 < 1) {
          Abc_TgManCopy(&tgManCopy,Abc_TtCanonicizeCA::pCopy,&tgMan);
          Abc_TgSimpleEnumeration(&tgMan);
          iVar2 = Abc_TtHieRetrieveOrInsert(p,-2,pTruth,pTruth);
          if (iVar2 < 1) {
            Abc_TgManCopy(&tgMan,pTruth,&tgManCopy);
            Abc_TtFill(pTruth,iVar3);
            iVar3 = Abc_TgCannonVerify(&tgManCopy);
            if (iVar3 == 0) {
              __assert_fail("Abc_TgCannonVerify(&tgManCopy)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                            ,0xa6f,
                            "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                           );
            }
            c = Abc_TgRecordPhase(&tgManCopy,0);
            uVar6 = 0;
            if (fCA != 0) {
              dVar7 = Abc_SccEnumCost(&tgManCopy,c);
              uVar6 = 0;
              if ((double)tgManCopy.nVars * 0.997 + (double)tgManCopy.nGVars * 1.043 + -15.9 < dVar7
                 ) {
                for (uVar4 = 1; (long)uVar4 < (long)tgManCopy.nGVars; uVar4 = uVar4 + 1) {
                  cVar1 = tgManCopy.pPerm[uVar4];
                  for (uVar5 = uVar4 & 0xffffffff; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1))
                  {
                    if (tgManCopy.pPerm[uVar5 - 1] <= cVar1) goto LAB_0042fe6e;
                    tgManCopy.pPerm[uVar5] = tgManCopy.pPerm[uVar5 - 1];
                  }
                  uVar5 = 0;
LAB_0042fe6e:
                  tgManCopy.pPerm[uVar5] = cVar1;
                }
                Abc_TgExpendSymmetry(&tgManCopy,local_1c8);
                Abc_TgImplementPerm(&tgManCopy,local_1c8);
                tgManCopy.fPhased = 0;
                tgManCopy.nGroups = 1;
                tgManCopy.pGroup[0].nGVars = (char)tgManCopy.nGVars;
                (tgManCopy.vPhase)->nSize = 0;
                Abc_TgRecordPhase(&tgManCopy,1);
                uVar6 = 0x10000000;
              }
            }
            Abc_TgFullEnumeration(&tgManCopy,&tgMan);
            Abc_TtHieRetrieveOrInsert(p,-1,pTruth,pTruth);
            memcpy(pCanonPerm,tgMan.pPermT,(long)nVars);
            iVar3 = Abc_TgCannonVerify(&tgMan);
            if (iVar3 == 0) {
              puts("Canonical form verification failed!");
            }
            uVar6 = uVar6 | tgMan.uPhase;
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int fCA)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned fHard = 0, fHash = 1 << 29;
    static word pCopy[1024];
    Abc_TgMan_t tgMan, tgManCopy;
    Abc_SccCost_t sc;

    // handle constant
    if (nVars == 0) {
        Abc_TtClear(pTruth, nWords);
        return 0;
    }

    Abc_TtVerifySmallTruth(pTruth, nVars);
#ifdef CANON_VERIFY
    Abc_TtCopy(gpVerCopy, pTruth, nWords, 0);
#endif

    assert(nVars <= 16);
    assert(p != NULL);
    if (Abc_TtHieRetrieveOrInsert(p, -5, pTruth, pTruth) > 0) return fHash;
    Abc_TgInitMan(&tgMan, pTruth, nVars, 2, p->vPhase);

    Abc_TgCreateGroups(&tgMan);
    if (p && Abc_TtHieRetrieveOrInsert(p, -4, pTruth, pTruth) > 0) return fHash;
    Abc_TgPurgeSymmetry(&tgMan, 1);

    Abc_TgExpendSymmetry(&tgMan, pCanonPerm);
    Abc_TgImplementPerm(&tgMan, pCanonPerm);
    assert(Abc_TgCannonVerify(&tgMan));

    if (Abc_TtHieRetrieveOrInsert(p, -3, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgManCopy, pCopy, &tgMan);
    Abc_TgSimpleEnumeration(&tgMan);
    if (Abc_TtHieRetrieveOrInsert(p, -2, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgMan, pTruth, &tgManCopy);
    Abc_TtFill(pTruth, nWords);

    assert(Abc_TgCannonVerify(&tgManCopy));
    sc = Abc_TgRecordPhase(&tgManCopy, 0);
    if (fCA && Abc_SccEnumCost(&tgManCopy, sc) > Abc_SccPhaseCost(&tgManCopy))
    {
        Abc_TgResetGroup(&tgManCopy);
        sc = Abc_TgRecordPhase(&tgManCopy, 1);
        fHard = 1 << 28;
    }
    Abc_TgFullEnumeration(&tgManCopy, &tgMan);
    Abc_TtHieRetrieveOrInsert(p, -1, pTruth, pTruth);
    memcpy(pCanonPerm, tgMan.pPermT, sizeof(char) * nVars);

#ifdef CANON_VERIFY
    if (!Abc_TgCannonVerify(&tgMan))
        printf("Canonical form verification failed!\n");
#endif
    return tgMan.uPhase | fHard;
}